

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Error storeAtts(XML_Parser parser,ENCODING *enc,char *attStr,TAG_NAME *tagNamePtr,
                   BINDING **bindingsPtr,XML_Account account)

{
  STRING_POOL *pool;
  XML_Char XVar1;
  char cVar2;
  DTD *pDVar3;
  ATTRIBUTE *pAVar4;
  DEFAULT_ATTRIBUTE *pDVar5;
  XML_Parser pXVar6;
  undefined8 *puVar7;
  XML_Char *pXVar8;
  byte bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  XML_Bool XVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  XML_Error XVar16;
  uint uVar17;
  int iVar18;
  ELEMENT_TYPE *elementType;
  ATTRIBUTE *pAVar19;
  ATTRIBUTE_ID *pAVar20;
  XML_Char *pXVar21;
  long lVar22;
  NS_ATT *pNVar23;
  NAMED *pNVar24;
  size_t sVar25;
  uint64_t uVar26;
  char *pcVar27;
  BINDING *pBVar28;
  TAG *pTVar29;
  int iVar30;
  XML_Parser pXVar31;
  NS_ATT *pNVar32;
  long lVar33;
  size_t sVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  unsigned_long uVar38;
  ulong uVar39;
  char *pcVar40;
  ulong uVar41;
  bool bVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  siphash sip_state;
  XML_Account in_stack_ffffffffffffff18;
  siphash local_68;
  
  pDVar3 = parser->m_dtd;
  elementType = (ELEMENT_TYPE *)lookup(parser,&pDVar3->elementTypes,tagNamePtr->str,0);
  if (elementType == (ELEMENT_TYPE *)0x0) {
    pXVar21 = poolCopyString(&pDVar3->pool,tagNamePtr->str);
    if (pXVar21 == (XML_Char *)0x0) {
      return XML_ERROR_NO_MEMORY;
    }
    elementType = (ELEMENT_TYPE *)lookup(parser,&pDVar3->elementTypes,pXVar21,0x28);
    if (elementType == (ELEMENT_TYPE *)0x0) {
      return XML_ERROR_NO_MEMORY;
    }
    if ((parser->m_ns != '\0') && (iVar18 = setElementTypePrefix(parser,elementType), iVar18 == 0))
    {
      return XML_ERROR_NO_MEMORY;
    }
  }
  uVar17 = elementType->nDefaultAtts;
  uVar13 = (*enc->getAtts)(enc,attStr,parser->m_attsSize,parser->m_atts);
  if ((int)(uVar17 ^ 0x7fffffff) < (int)uVar13) {
    return XML_ERROR_NO_MEMORY;
  }
  iVar14 = uVar13 + uVar17;
  iVar18 = parser->m_attsSize;
  if (iVar18 < iVar14) {
    if ((int)(0x7fffffef - uVar17) < (int)uVar13 || 0x7fffffef < (int)uVar17) {
      return XML_ERROR_NO_MEMORY;
    }
    parser->m_attsSize = iVar14 + 0x10;
    pAVar19 = (ATTRIBUTE *)
              (*(parser->m_mem).realloc_fcn)(parser->m_atts,(long)iVar14 * 0x20 + 0x200);
    if (pAVar19 == (ATTRIBUTE *)0x0) {
      parser->m_attsSize = iVar18;
      return XML_ERROR_NO_MEMORY;
    }
    parser->m_atts = pAVar19;
    if (iVar18 < (int)uVar13) {
      (*enc->getAtts)(enc,attStr,uVar13,pAVar19);
    }
  }
  pAVar19 = parser->m_atts;
  if ((int)uVar13 < 1) {
    iVar14 = 0;
    iVar18 = 0;
  }
  else {
    uVar39 = 0;
    iVar18 = 0;
    iVar14 = 0;
    do {
      pcVar40 = parser->m_atts[uVar39].name;
      iVar15 = (*enc->nameLength)(enc,pcVar40);
      pAVar20 = getAttributeId(parser,enc,pcVar40,pcVar40 + iVar15);
      if (pAVar20 == (ATTRIBUTE_ID *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      if (pAVar20->name[-1] != '\0') {
        if (parser->m_encoding == enc) {
          parser->m_eventPtr = parser->m_atts[uVar39].name;
          return XML_ERROR_DUPLICATE_ATTRIBUTE;
        }
        return XML_ERROR_DUPLICATE_ATTRIBUTE;
      }
      pAVar20->name[-1] = '\x01';
      iVar15 = iVar18 + 1;
      (&pAVar19->name)[iVar18] = pAVar20->name;
      pAVar4 = parser->m_atts;
      if (pAVar4[uVar39].normalized == '\0') {
        XVar12 = '\x01';
        if ((pAVar20->maybeTokenized != '\0') && (0 < (int)uVar17)) {
          lVar22 = 0;
          do {
            if (pAVar20 == *(ATTRIBUTE_ID **)((long)&elementType->defaultAtts->id + lVar22)) {
              XVar12 = (&elementType->defaultAtts->isCdata)[lVar22];
              break;
            }
            lVar22 = lVar22 + 0x18;
          } while ((ulong)uVar17 * 0x18 != lVar22);
        }
        XVar16 = storeAttributeValue(parser,enc,XVar12,pAVar4[uVar39].valuePtr,
                                     pAVar4[uVar39].valueEnd,&parser->m_tempPool,
                                     in_stack_ffffffffffffff18);
        if (XVar16 != XML_ERROR_NONE) {
          return XVar16;
        }
        (&pAVar19->name)[iVar15] = (parser->m_tempPool).start;
      }
      else {
        pXVar21 = poolStoreString(&parser->m_tempPool,enc,pAVar4[uVar39].valuePtr,
                                  pAVar4[uVar39].valueEnd);
        (&pAVar19->name)[iVar15] = pXVar21;
        if (pXVar21 == (XML_Char *)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
      }
      (parser->m_tempPool).start = (parser->m_tempPool).ptr;
      if (pAVar20->prefix == (PREFIX *)0x0) {
        iVar18 = iVar18 + 2;
      }
      else if (pAVar20->xmlns == '\0') {
        iVar18 = iVar18 + 2;
        iVar14 = iVar14 + 1;
        pAVar20->name[-1] = '\x02';
      }
      else {
        XVar16 = addBinding(parser,pAVar20->prefix,pAVar20,(&pAVar19->name)[iVar15],bindingsPtr);
        if (XVar16 != XML_ERROR_NONE) {
          return XVar16;
        }
      }
      uVar39 = uVar39 + 1;
    } while (uVar39 != uVar13);
  }
  parser->m_nSpecifiedAtts = iVar18;
  lVar22 = 0xffffffff;
  if ((elementType->idAtt == (ATTRIBUTE_ID *)0x0) ||
     (pXVar21 = elementType->idAtt->name, pXVar21[-1] == '\0')) {
LAB_00628f01:
    parser->m_idAttIndex = (int)lVar22;
  }
  else if (0 < iVar18) {
    lVar22 = 0;
    do {
      if ((&pAVar19->name)[lVar22] == pXVar21) goto LAB_00628f01;
      lVar22 = lVar22 + 2;
    } while ((int)lVar22 < iVar18);
  }
  if (0 < (int)uVar17) {
    lVar22 = 0;
    do {
      pDVar5 = elementType->defaultAtts;
      pAVar20 = *(ATTRIBUTE_ID **)((long)&pDVar5->id + lVar22);
      pXVar21 = pAVar20->name;
      if ((pXVar21[-1] == '\0') &&
         (pXVar8 = *(XML_Char **)((long)&pDVar5->value + lVar22), pXVar8 != (XML_Char *)0x0)) {
        if (pAVar20->prefix == (PREFIX *)0x0) {
          pXVar21[-1] = '\x01';
        }
        else {
          if (pAVar20->xmlns != '\0') {
            XVar16 = addBinding(parser,pAVar20->prefix,pAVar20,pXVar8,bindingsPtr);
            if (XVar16 != XML_ERROR_NONE) {
              return XVar16;
            }
            goto LAB_00628f2c;
          }
          pXVar21[-1] = '\x02';
          iVar14 = iVar14 + 1;
        }
        (&pAVar19->name)[iVar18] = (char *)**(undefined8 **)((long)&pDVar5->id + lVar22);
        (&pAVar19->valuePtr)[iVar18] = *(char **)((long)&pDVar5->value + lVar22);
        iVar18 = iVar18 + 2;
      }
LAB_00628f2c:
      lVar22 = lVar22 + 0x18;
    } while ((ulong)uVar17 * 0x18 != lVar22);
  }
  (&pAVar19->name)[iVar18] = (char *)0x0;
  uVar39 = 0;
  if (iVar14 == 0) goto LAB_0062959b;
  bVar37 = parser->m_nsAttsPower;
  if (0x1f < bVar37) {
    return XML_ERROR_NO_MEMORY;
  }
  bVar35 = bVar37;
  if (iVar14 * 2 >> (bVar37 & 0x1f) == 0) {
    uVar38 = parser->m_nsAttsVersion;
    iVar15 = 1 << (bVar37 & 0x1f);
    if (uVar38 == 0) goto LAB_006290c6;
  }
  else {
    do {
      bVar36 = bVar35 + 1;
      bVar9 = bVar35 & 0x1f;
      bVar35 = bVar36;
    } while (iVar14 >> bVar9 != 0);
    parser->m_nsAttsPower = bVar36;
    if (bVar36 < 3) {
      parser->m_nsAttsPower = '\x03';
      bVar36 = 3;
    }
    else if (0x1f < bVar36) {
      parser->m_nsAttsPower = bVar37;
      return XML_ERROR_NO_MEMORY;
    }
    pNVar23 = (NS_ATT *)(*(parser->m_mem).realloc_fcn)(parser->m_nsAtts,0x18L << (bVar36 & 0x3f));
    if (pNVar23 == (NS_ATT *)0x0) {
      parser->m_nsAttsPower = bVar37;
      return XML_ERROR_NO_MEMORY;
    }
    parser->m_nsAtts = pNVar23;
    iVar15 = 1 << (bVar36 & 0x1f);
LAB_006290c6:
    auVar11 = _DAT_0078f6c0;
    auVar10 = _DAT_0078f6b0;
    uVar38 = 0xffffffff;
    lVar33 = (long)iVar15;
    lVar22 = lVar33 + -1;
    auVar43._8_4_ = (int)lVar22;
    auVar43._0_8_ = lVar22;
    auVar43._12_4_ = (int)((ulong)lVar22 >> 0x20);
    pNVar23 = parser->m_nsAtts + lVar33 + -1;
    uVar39 = 0;
    auVar43 = auVar43 ^ _DAT_0078f6c0;
    do {
      auVar44._8_4_ = (int)uVar39;
      auVar44._0_8_ = uVar39;
      auVar44._12_4_ = (int)(uVar39 >> 0x20);
      auVar44 = (auVar44 | auVar10) ^ auVar11;
      if ((bool)(~(auVar44._4_4_ == auVar43._4_4_ && auVar43._0_4_ < auVar44._0_4_ ||
                  auVar43._4_4_ < auVar44._4_4_) & 1)) {
        pNVar23->version = 0xffffffff;
      }
      if ((auVar44._12_4_ != auVar43._12_4_ || auVar44._8_4_ <= auVar43._8_4_) &&
          auVar44._12_4_ <= auVar43._12_4_) {
        pNVar23[-1].version = 0xffffffff;
      }
      uVar39 = uVar39 + 2;
      pNVar23 = pNVar23 + -2;
    } while ((lVar33 + 1U & 0xfffffffffffffffe) != uVar39);
  }
  uVar39 = 0;
  uVar38 = uVar38 - 1;
  parser->m_nsAttsVersion = uVar38;
  if (0 < iVar18) {
    pool = &parser->m_tempPool;
    uVar17 = iVar15 - 1;
    uVar39 = 0;
    do {
      pcVar40 = (&pAVar19->name)[uVar39];
      pXVar6 = parser;
      if (pcVar40[-1] == '\x02') {
        do {
          pXVar31 = pXVar6;
          pXVar6 = pXVar31->m_parentParser;
        } while (pXVar6 != (XML_Parser)0x0);
        local_68.v3 = pXVar31->m_hash_secret_salt;
        local_68.v0 = 0x736f6d6570736575;
        local_68.v1 = local_68.v3 ^ 0x646f72616e646f6d;
        local_68.v2 = 0x6c7967656e657261;
        local_68.v3 = local_68.v3 ^ 0x7465646279746573;
        local_68.c = 0;
        pcVar40[-1] = '\0';
        local_68.p = local_68.buf;
        pNVar24 = lookup(parser,&pDVar3->attributeIds,pcVar40,0);
        if (pNVar24 == (NAMED *)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
        if (pNVar24[1].name == (KEY)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
        puVar7 = *(undefined8 **)(pNVar24[1].name + 8);
        if (puVar7 == (undefined8 *)0x0) {
          return XML_ERROR_UNBOUND_PREFIX;
        }
        sVar34 = (size_t)*(int *)(puVar7 + 5);
        if (0 < (long)sVar34) {
          lVar22 = 0;
          do {
            XVar1 = *(XML_Char *)(puVar7[4] + lVar22);
            pXVar21 = (parser->m_tempPool).ptr;
            if (pXVar21 == (parser->m_tempPool).end) {
              XVar12 = poolGrow(pool);
              if (XVar12 == '\0') {
                return XML_ERROR_NO_MEMORY;
              }
              pXVar21 = (parser->m_tempPool).ptr;
            }
            (parser->m_tempPool).ptr = pXVar21 + 1;
            *pXVar21 = XVar1;
            lVar22 = lVar22 + 1;
            sVar34 = (size_t)*(int *)(puVar7 + 5);
          } while (lVar22 < (long)sVar34);
        }
        sip24_update(&local_68,(void *)puVar7[4],sVar34);
        do {
          pcVar27 = pcVar40;
          pcVar40 = pcVar27 + 1;
        } while (*pcVar27 != ':');
        if (*pcVar40 == '\0') {
          sVar34 = 0;
        }
        else {
          sVar25 = 0;
          do {
            sVar34 = sVar25 + 1;
            lVar22 = sVar25 + 2;
            sVar25 = sVar34;
          } while (pcVar27[lVar22] != '\0');
        }
        sip24_update(&local_68,pcVar40,sVar34);
        do {
          pcVar27 = (parser->m_tempPool).ptr;
          if (pcVar27 == (parser->m_tempPool).end) {
            XVar12 = poolGrow(pool);
            if (XVar12 == '\0') {
              return XML_ERROR_NO_MEMORY;
            }
            pcVar27 = (parser->m_tempPool).ptr;
          }
          cVar2 = *pcVar40;
          (parser->m_tempPool).ptr = pcVar27 + 1;
          *pcVar27 = cVar2;
          cVar2 = *pcVar40;
          pcVar40 = pcVar40 + 1;
        } while (cVar2 != '\0');
        uVar26 = sip24_final(&local_68);
        uVar13 = uVar17 & (uint)uVar26;
        pNVar23 = parser->m_nsAtts;
        lVar22 = (long)(int)uVar13;
        if (pNVar23[lVar22].version == uVar38) {
          pNVar32 = pNVar23 + lVar22;
          bVar37 = 0;
          do {
            if (uVar26 == pNVar32->hash) {
              pcVar40 = (parser->m_tempPool).start;
              cVar2 = *pcVar40;
              bVar42 = cVar2 == '\0';
              if ((!bVar42) && (cVar2 == *pNVar32->uriName)) {
                lVar22 = 1;
                do {
                  cVar2 = pcVar40[lVar22];
                  bVar42 = cVar2 == '\0';
                  if (bVar42) break;
                  pcVar27 = pNVar32->uriName + lVar22;
                  lVar22 = lVar22 + 1;
                } while (cVar2 == *pcVar27);
              }
              if (bVar42) {
                return XML_ERROR_DUPLICATE_ATTRIBUTE;
              }
            }
            if (bVar37 == 0) {
              bVar37 = (byte)((uVar26 & ~(ulong)uVar17) >>
                             ((char)*(undefined4 *)&parser->m_nsAttsPower - 1U & 0x3f)) &
                       (byte)(uVar17 >> 2) | 1;
            }
            iVar30 = 0;
            if ((int)uVar13 < (int)(uint)bVar37) {
              iVar30 = iVar15;
            }
            uVar13 = (uVar13 - bVar37) + iVar30;
            lVar22 = (long)(int)uVar13;
            pNVar32 = pNVar23 + lVar22;
          } while (pNVar32->version == uVar38);
        }
        if (parser->m_ns_triplets != '\0') {
          (parser->m_tempPool).ptr[-1] = parser->m_namespaceSeparator;
          pcVar40 = *(char **)*puVar7;
          do {
            pcVar27 = (parser->m_tempPool).ptr;
            if (pcVar27 == (parser->m_tempPool).end) {
              XVar12 = poolGrow(pool);
              if (XVar12 == '\0') {
                return XML_ERROR_NO_MEMORY;
              }
              pcVar27 = (parser->m_tempPool).ptr;
            }
            cVar2 = *pcVar40;
            (parser->m_tempPool).ptr = pcVar27 + 1;
            *pcVar27 = cVar2;
            cVar2 = *pcVar40;
            pcVar40 = pcVar40 + 1;
          } while (cVar2 != '\0');
        }
        pcVar40 = (parser->m_tempPool).start;
        (parser->m_tempPool).start = (parser->m_tempPool).ptr;
        (&pAVar19->name)[uVar39] = pcVar40;
        pNVar23 = parser->m_nsAtts;
        pNVar23[lVar22].version = uVar38;
        pNVar23[lVar22].hash = uVar26;
        pNVar23[lVar22].uriName = pcVar40;
        iVar14 = iVar14 + -1;
        if (iVar14 == 0) {
          uVar39 = (ulong)((int)uVar39 + 2);
          break;
        }
      }
      else {
        pcVar40[-1] = '\0';
      }
      uVar39 = uVar39 + 2;
    } while ((int)uVar39 < iVar18);
  }
LAB_0062959b:
  if ((int)uVar39 < iVar18) {
    lVar22 = (long)(int)uVar39;
    do {
      (&pAVar19->name)[lVar22][-1] = '\0';
      lVar22 = lVar22 + 2;
    } while (lVar22 < iVar18);
  }
  for (pBVar28 = *bindingsPtr; pBVar28 != (BINDING *)0x0; pBVar28 = pBVar28->nextTagBinding) {
    pBVar28->attId->name[-1] = '\0';
  }
  if (parser->m_ns == '\0') {
    return XML_ERROR_NONE;
  }
  if (elementType->prefix == (PREFIX *)0x0) {
    pBVar28 = (pDVar3->defaultPrefix).binding;
    if (pBVar28 == (BINDING *)0x0) {
      return XML_ERROR_NONE;
    }
    pcVar40 = tagNamePtr->str;
  }
  else {
    pBVar28 = elementType->prefix->binding;
    if (pBVar28 == (BINDING *)0x0) {
      return XML_ERROR_UNBOUND_PREFIX;
    }
    pcVar40 = tagNamePtr->str;
    do {
      cVar2 = *pcVar40;
      pcVar40 = pcVar40 + 1;
    } while (cVar2 != ':');
  }
  lVar22 = 0;
  pXVar21 = pBVar28->prefix->name;
  if ((parser->m_ns_triplets != '\0') && (pXVar21 != (XML_Char *)0x0)) {
    lVar22 = 0;
    do {
      pcVar27 = pXVar21 + lVar22;
      lVar22 = lVar22 + 1;
    } while (*pcVar27 != '\0');
  }
  tagNamePtr->localPart = pcVar40;
  iVar18 = pBVar28->uriLen;
  tagNamePtr->uriLen = iVar18;
  tagNamePtr->prefix = pXVar21;
  uVar17 = (uint)lVar22;
  tagNamePtr->prefixLen = uVar17;
  uVar39 = 0;
  do {
    uVar41 = uVar39;
    uVar39 = uVar41 + 1;
  } while (pcVar40[uVar41] != '\0');
  if (iVar18 <= (int)(uVar17 ^ 0x7fffffff)) {
    iVar14 = (int)uVar39;
    uVar13 = uVar17 + iVar18;
    if (iVar14 - 1U < (uVar13 ^ 0x7fffffff)) {
      if (pBVar28->uriAlloc < (int)(uVar13 + iVar14)) {
        if (0x7fffffe7 < (int)(uVar13 + iVar14)) {
          return XML_ERROR_NO_MEMORY;
        }
        iVar18 = uVar13 + iVar14 + 0x18;
        pXVar21 = (XML_Char *)(*(parser->m_mem).malloc_fcn)((long)iVar18);
        if (pXVar21 == (XML_Char *)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
        pBVar28->uriAlloc = iVar18;
        memcpy(pXVar21,pBVar28->uri,(long)pBVar28->uriLen);
        pXVar8 = pBVar28->uri;
        for (pTVar29 = parser->m_tagStack; pTVar29 != (TAG *)0x0; pTVar29 = pTVar29->parent) {
          if ((pTVar29->name).str == pXVar8) {
            (pTVar29->name).str = pXVar21;
          }
        }
        (*(parser->m_mem).free_fcn)(pXVar8);
        pBVar28->uri = pXVar21;
        iVar18 = pBVar28->uriLen;
      }
      else {
        pXVar21 = pBVar28->uri;
      }
      pXVar21 = pXVar21 + iVar18;
      memcpy(pXVar21,pcVar40,uVar39 & 0xffffffff);
      if (uVar17 != 0) {
        pXVar21[uVar41] = parser->m_namespaceSeparator;
        memcpy(pXVar21 + uVar39,pBVar28->prefix->name,(long)(int)uVar17);
      }
      tagNamePtr->str = pBVar28->uri;
      return XML_ERROR_NONE;
    }
  }
  return XML_ERROR_NO_MEMORY;
}

Assistant:

static enum XML_Error
storeAtts(XML_Parser parser, const ENCODING *enc, const char *attStr,
          TAG_NAME *tagNamePtr, BINDING **bindingsPtr,
          enum XML_Account account) {
  DTD *const dtd = parser->m_dtd; /* save one level of indirection */
  ELEMENT_TYPE *elementType;
  int nDefaultAtts;
  const XML_Char **appAtts; /* the attribute list for the application */
  int attIndex = 0;
  int prefixLen;
  int i;
  int n;
  XML_Char *uri;
  int nPrefixes = 0;
  BINDING *binding;
  const XML_Char *localPart;

  /* lookup the element type name */
  elementType
      = (ELEMENT_TYPE *)lookup(parser, &dtd->elementTypes, tagNamePtr->str, 0);
  if (! elementType) {
    const XML_Char *name = poolCopyString(&dtd->pool, tagNamePtr->str);
    if (! name)
      return XML_ERROR_NO_MEMORY;
    elementType = (ELEMENT_TYPE *)lookup(parser, &dtd->elementTypes, name,
                                         sizeof(ELEMENT_TYPE));
    if (! elementType)
      return XML_ERROR_NO_MEMORY;
    if (parser->m_ns && ! setElementTypePrefix(parser, elementType))
      return XML_ERROR_NO_MEMORY;
  }
  nDefaultAtts = elementType->nDefaultAtts;

  /* get the attributes from the tokenizer */
  n = XmlGetAttributes(enc, attStr, parser->m_attsSize, parser->m_atts);

  /* Detect and prevent integer overflow */
  if (n > INT_MAX - nDefaultAtts) {
    return XML_ERROR_NO_MEMORY;
  }

  if (n + nDefaultAtts > parser->m_attsSize) {
    int oldAttsSize = parser->m_attsSize;
    ATTRIBUTE *temp;
#ifdef XML_ATTR_INFO
    XML_AttrInfo *temp2;
#endif

    /* Detect and prevent integer overflow */
    if ((nDefaultAtts > INT_MAX - INIT_ATTS_SIZE)
        || (n > INT_MAX - (nDefaultAtts + INIT_ATTS_SIZE))) {
      return XML_ERROR_NO_MEMORY;
    }

    parser->m_attsSize = n + nDefaultAtts + INIT_ATTS_SIZE;

    /* Detect and prevent integer overflow.
     * The preprocessor guard addresses the "always false" warning
     * from -Wtype-limits on platforms where
     * sizeof(unsigned int) < sizeof(size_t), e.g. on x86_64. */
#if UINT_MAX >= SIZE_MAX
    if ((unsigned)parser->m_attsSize > (size_t)(-1) / sizeof(ATTRIBUTE)) {
      parser->m_attsSize = oldAttsSize;
      return XML_ERROR_NO_MEMORY;
    }
#endif

    temp = (ATTRIBUTE *)REALLOC(parser, (void *)parser->m_atts,
                                parser->m_attsSize * sizeof(ATTRIBUTE));
    if (temp == NULL) {
      parser->m_attsSize = oldAttsSize;
      return XML_ERROR_NO_MEMORY;
    }
    parser->m_atts = temp;
#ifdef XML_ATTR_INFO
    /* Detect and prevent integer overflow.
     * The preprocessor guard addresses the "always false" warning
     * from -Wtype-limits on platforms where
     * sizeof(unsigned int) < sizeof(size_t), e.g. on x86_64. */
#  if UINT_MAX >= SIZE_MAX
    if ((unsigned)parser->m_attsSize > (size_t)(-1) / sizeof(XML_AttrInfo)) {
      parser->m_attsSize = oldAttsSize;
      return XML_ERROR_NO_MEMORY;
    }
#  endif

    temp2 = (XML_AttrInfo *)REALLOC(parser, (void *)parser->m_attInfo,
                                    parser->m_attsSize * sizeof(XML_AttrInfo));
    if (temp2 == NULL) {
      parser->m_attsSize = oldAttsSize;
      return XML_ERROR_NO_MEMORY;
    }
    parser->m_attInfo = temp2;
#endif
    if (n > oldAttsSize)
      XmlGetAttributes(enc, attStr, n, parser->m_atts);
  }

  appAtts = (const XML_Char **)parser->m_atts;
  for (i = 0; i < n; i++) {
    ATTRIBUTE *currAtt = &parser->m_atts[i];
#ifdef XML_ATTR_INFO
    XML_AttrInfo *currAttInfo = &parser->m_attInfo[i];
#endif
    /* add the name and value to the attribute list */
    ATTRIBUTE_ID *attId
        = getAttributeId(parser, enc, currAtt->name,
                         currAtt->name + XmlNameLength(enc, currAtt->name));
    if (! attId)
      return XML_ERROR_NO_MEMORY;
#ifdef XML_ATTR_INFO
    currAttInfo->nameStart
        = parser->m_parseEndByteIndex - (parser->m_parseEndPtr - currAtt->name);
    currAttInfo->nameEnd
        = currAttInfo->nameStart + XmlNameLength(enc, currAtt->name);
    currAttInfo->valueStart = parser->m_parseEndByteIndex
                              - (parser->m_parseEndPtr - currAtt->valuePtr);
    currAttInfo->valueEnd = parser->m_parseEndByteIndex
                            - (parser->m_parseEndPtr - currAtt->valueEnd);
#endif
    /* Detect duplicate attributes by their QNames. This does not work when
       namespace processing is turned on and different prefixes for the same
       namespace are used. For this case we have a check further down.
    */
    if ((attId->name)[-1]) {
      if (enc == parser->m_encoding)
        parser->m_eventPtr = parser->m_atts[i].name;
      return XML_ERROR_DUPLICATE_ATTRIBUTE;
    }
    (attId->name)[-1] = 1;
    appAtts[attIndex++] = attId->name;
    if (! parser->m_atts[i].normalized) {
      enum XML_Error result;
      XML_Bool isCdata = XML_TRUE;

      /* figure out whether declared as other than CDATA */
      if (attId->maybeTokenized) {
        int j;
        for (j = 0; j < nDefaultAtts; j++) {
          if (attId == elementType->defaultAtts[j].id) {
            isCdata = elementType->defaultAtts[j].isCdata;
            break;
          }
        }
      }

      /* normalize the attribute value */
      result = storeAttributeValue(
          parser, enc, isCdata, parser->m_atts[i].valuePtr,
          parser->m_atts[i].valueEnd, &parser->m_tempPool, account);
      if (result)
        return result;
      appAtts[attIndex] = poolStart(&parser->m_tempPool);
      poolFinish(&parser->m_tempPool);
    } else {
      /* the value did not need normalizing */
      appAtts[attIndex] = poolStoreString(&parser->m_tempPool, enc,
                                          parser->m_atts[i].valuePtr,
                                          parser->m_atts[i].valueEnd);
      if (appAtts[attIndex] == 0)
        return XML_ERROR_NO_MEMORY;
      poolFinish(&parser->m_tempPool);
    }
    /* handle prefixed attribute names */
    if (attId->prefix) {
      if (attId->xmlns) {
        /* deal with namespace declarations here */
        enum XML_Error result = addBinding(parser, attId->prefix, attId,
                                           appAtts[attIndex], bindingsPtr);
        if (result)
          return result;
        --attIndex;
      } else {
        /* deal with other prefixed names later */
        attIndex++;
        nPrefixes++;
        (attId->name)[-1] = 2;
      }
    } else
      attIndex++;
  }

  /* set-up for XML_GetSpecifiedAttributeCount and XML_GetIdAttributeIndex */
  parser->m_nSpecifiedAtts = attIndex;
  if (elementType->idAtt && (elementType->idAtt->name)[-1]) {
    for (i = 0; i < attIndex; i += 2)
      if (appAtts[i] == elementType->idAtt->name) {
        parser->m_idAttIndex = i;
        break;
      }
  } else
    parser->m_idAttIndex = -1;

  /* do attribute defaulting */
  for (i = 0; i < nDefaultAtts; i++) {
    const DEFAULT_ATTRIBUTE *da = elementType->defaultAtts + i;
    if (! (da->id->name)[-1] && da->value) {
      if (da->id->prefix) {
        if (da->id->xmlns) {
          enum XML_Error result = addBinding(parser, da->id->prefix, da->id,
                                             da->value, bindingsPtr);
          if (result)
            return result;
        } else {
          (da->id->name)[-1] = 2;
          nPrefixes++;
          appAtts[attIndex++] = da->id->name;
          appAtts[attIndex++] = da->value;
        }
      } else {
        (da->id->name)[-1] = 1;
        appAtts[attIndex++] = da->id->name;
        appAtts[attIndex++] = da->value;
      }
    }
  }
  appAtts[attIndex] = 0;

  /* expand prefixed attribute names, check for duplicates,
     and clear flags that say whether attributes were specified */
  i = 0;
  if (nPrefixes) {
    int j; /* hash table index */
    unsigned long version = parser->m_nsAttsVersion;

    /* Detect and prevent invalid shift */
    if (parser->m_nsAttsPower >= sizeof(unsigned int) * 8 /* bits per byte */) {
      return XML_ERROR_NO_MEMORY;
    }

    unsigned int nsAttsSize = 1u << parser->m_nsAttsPower;
    unsigned char oldNsAttsPower = parser->m_nsAttsPower;
    /* size of hash table must be at least 2 * (# of prefixed attributes) */
    if ((nPrefixes << 1)
        >> parser->m_nsAttsPower) { /* true for m_nsAttsPower = 0 */
      NS_ATT *temp;
      /* hash table size must also be a power of 2 and >= 8 */
      while (nPrefixes >> parser->m_nsAttsPower++)
        ;
      if (parser->m_nsAttsPower < 3)
        parser->m_nsAttsPower = 3;

      /* Detect and prevent invalid shift */
      if (parser->m_nsAttsPower >= sizeof(nsAttsSize) * 8 /* bits per byte */) {
        /* Restore actual size of memory in m_nsAtts */
        parser->m_nsAttsPower = oldNsAttsPower;
        return XML_ERROR_NO_MEMORY;
      }

      nsAttsSize = 1u << parser->m_nsAttsPower;

      /* Detect and prevent integer overflow.
       * The preprocessor guard addresses the "always false" warning
       * from -Wtype-limits on platforms where
       * sizeof(unsigned int) < sizeof(size_t), e.g. on x86_64. */
#if UINT_MAX >= SIZE_MAX
      if (nsAttsSize > (size_t)(-1) / sizeof(NS_ATT)) {
        /* Restore actual size of memory in m_nsAtts */
        parser->m_nsAttsPower = oldNsAttsPower;
        return XML_ERROR_NO_MEMORY;
      }
#endif

      temp = (NS_ATT *)REALLOC(parser, parser->m_nsAtts,
                               nsAttsSize * sizeof(NS_ATT));
      if (! temp) {
        /* Restore actual size of memory in m_nsAtts */
        parser->m_nsAttsPower = oldNsAttsPower;
        return XML_ERROR_NO_MEMORY;
      }
      parser->m_nsAtts = temp;
      version = 0; /* force re-initialization of m_nsAtts hash table */
    }
    /* using a version flag saves us from initializing m_nsAtts every time */
    if (! version) { /* initialize version flags when version wraps around */
      version = INIT_ATTS_VERSION;
      for (j = nsAttsSize; j != 0;)
        parser->m_nsAtts[--j].version = version;
    }
    parser->m_nsAttsVersion = --version;

    /* expand prefixed names and check for duplicates */
    for (; i < attIndex; i += 2) {
      const XML_Char *s = appAtts[i];
      if (s[-1] == 2) { /* prefixed */
        ATTRIBUTE_ID *id;
        const BINDING *b;
        unsigned long uriHash;
        struct siphash sip_state;
        struct sipkey sip_key;

        copy_salt_to_sipkey(parser, &sip_key);
        sip24_init(&sip_state, &sip_key);

        ((XML_Char *)s)[-1] = 0; /* clear flag */
        id = (ATTRIBUTE_ID *)lookup(parser, &dtd->attributeIds, s, 0);
        if (! id || ! id->prefix) {
          /* This code is walking through the appAtts array, dealing
           * with (in this case) a prefixed attribute name.  To be in
           * the array, the attribute must have already been bound, so
           * has to have passed through the hash table lookup once
           * already.  That implies that an entry for it already
           * exists, so the lookup above will return a pointer to
           * already allocated memory.  There is no opportunaity for
           * the allocator to fail, so the condition above cannot be
           * fulfilled.
           *
           * Since it is difficult to be certain that the above
           * analysis is complete, we retain the test and merely
           * remove the code from coverage tests.
           */
          return XML_ERROR_NO_MEMORY; /* LCOV_EXCL_LINE */
        }
        b = id->prefix->binding;
        if (! b)
          return XML_ERROR_UNBOUND_PREFIX;

        for (j = 0; j < b->uriLen; j++) {
          const XML_Char c = b->uri[j];
          if (! poolAppendChar(&parser->m_tempPool, c))
            return XML_ERROR_NO_MEMORY;
        }

        sip24_update(&sip_state, b->uri, b->uriLen * sizeof(XML_Char));

        while (*s++ != XML_T(ASCII_COLON))
          ;

        sip24_update(&sip_state, s, keylen(s) * sizeof(XML_Char));

        do { /* copies null terminator */
          if (! poolAppendChar(&parser->m_tempPool, *s))
            return XML_ERROR_NO_MEMORY;
        } while (*s++);

        uriHash = (unsigned long)sip24_final(&sip_state);

        { /* Check hash table for duplicate of expanded name (uriName).
             Derived from code in lookup(parser, HASH_TABLE *table, ...).
          */
          unsigned char step = 0;
          unsigned long mask = nsAttsSize - 1;
          j = uriHash & mask; /* index into hash table */
          while (parser->m_nsAtts[j].version == version) {
            /* for speed we compare stored hash values first */
            if (uriHash == parser->m_nsAtts[j].hash) {
              const XML_Char *s1 = poolStart(&parser->m_tempPool);
              const XML_Char *s2 = parser->m_nsAtts[j].uriName;
              /* s1 is null terminated, but not s2 */
              for (; *s1 == *s2 && *s1 != 0; s1++, s2++)
                ;
              if (*s1 == 0)
                return XML_ERROR_DUPLICATE_ATTRIBUTE;
            }
            if (! step)
              step = PROBE_STEP(uriHash, mask, parser->m_nsAttsPower);
            j < step ? (j += nsAttsSize - step) : (j -= step);
          }
        }

        if (parser->m_ns_triplets) { /* append namespace separator and prefix */
          parser->m_tempPool.ptr[-1] = parser->m_namespaceSeparator;
          s = b->prefix->name;
          do {
            if (! poolAppendChar(&parser->m_tempPool, *s))
              return XML_ERROR_NO_MEMORY;
          } while (*s++);
        }

        /* store expanded name in attribute list */
        s = poolStart(&parser->m_tempPool);
        poolFinish(&parser->m_tempPool);
        appAtts[i] = s;

        /* fill empty slot with new version, uriName and hash value */
        parser->m_nsAtts[j].version = version;
        parser->m_nsAtts[j].hash = uriHash;
        parser->m_nsAtts[j].uriName = s;

        if (! --nPrefixes) {
          i += 2;
          break;
        }
      } else                     /* not prefixed */
        ((XML_Char *)s)[-1] = 0; /* clear flag */
    }
  }
  /* clear flags for the remaining attributes */
  for (; i < attIndex; i += 2)
    ((XML_Char *)(appAtts[i]))[-1] = 0;
  for (binding = *bindingsPtr; binding; binding = binding->nextTagBinding)
    binding->attId->name[-1] = 0;

  if (! parser->m_ns)
    return XML_ERROR_NONE;

  /* expand the element type name */
  if (elementType->prefix) {
    binding = elementType->prefix->binding;
    if (! binding)
      return XML_ERROR_UNBOUND_PREFIX;
    localPart = tagNamePtr->str;
    while (*localPart++ != XML_T(ASCII_COLON))
      ;
  } else if (dtd->defaultPrefix.binding) {
    binding = dtd->defaultPrefix.binding;
    localPart = tagNamePtr->str;
  } else
    return XML_ERROR_NONE;
  prefixLen = 0;
  if (parser->m_ns_triplets && binding->prefix->name) {
    for (; binding->prefix->name[prefixLen++];)
      ; /* prefixLen includes null terminator */
  }
  tagNamePtr->localPart = localPart;
  tagNamePtr->uriLen = binding->uriLen;
  tagNamePtr->prefix = binding->prefix->name;
  tagNamePtr->prefixLen = prefixLen;
  for (i = 0; localPart[i++];)
    ; /* i includes null terminator */

  /* Detect and prevent integer overflow */
  if (binding->uriLen > INT_MAX - prefixLen
      || i > INT_MAX - (binding->uriLen + prefixLen)) {
    return XML_ERROR_NO_MEMORY;
  }

  n = i + binding->uriLen + prefixLen;
  if (n > binding->uriAlloc) {
    TAG *p;

    /* Detect and prevent integer overflow */
    if (n > INT_MAX - EXPAND_SPARE) {
      return XML_ERROR_NO_MEMORY;
    }
    /* Detect and prevent integer overflow.
     * The preprocessor guard addresses the "always false" warning
     * from -Wtype-limits on platforms where
     * sizeof(unsigned int) < sizeof(size_t), e.g. on x86_64. */
#if UINT_MAX >= SIZE_MAX
    if ((unsigned)(n + EXPAND_SPARE) > (size_t)(-1) / sizeof(XML_Char)) {
      return XML_ERROR_NO_MEMORY;
    }
#endif

    uri = (XML_Char *)MALLOC(parser, (n + EXPAND_SPARE) * sizeof(XML_Char));
    if (! uri)
      return XML_ERROR_NO_MEMORY;
    binding->uriAlloc = n + EXPAND_SPARE;
    memcpy(uri, binding->uri, binding->uriLen * sizeof(XML_Char));
    for (p = parser->m_tagStack; p; p = p->parent)
      if (p->name.str == binding->uri)
        p->name.str = uri;
    FREE(parser, binding->uri);
    binding->uri = uri;
  }
  /* if m_namespaceSeparator != '\0' then uri includes it already */
  uri = binding->uri + binding->uriLen;
  memcpy(uri, localPart, i * sizeof(XML_Char));
  /* we always have a namespace separator between localPart and prefix */
  if (prefixLen) {
    uri += i - 1;
    *uri = parser->m_namespaceSeparator; /* replace null terminator */
    memcpy(uri + 1, binding->prefix->name, prefixLen * sizeof(XML_Char));
  }
  tagNamePtr->str = binding->uri;
  return XML_ERROR_NONE;
}